

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

uint64_t __thiscall BitStreamReader<SpanReader>::Read(BitStreamReader<SpanReader> *this,int nbits)

{
  int iVar1;
  long lVar2;
  out_of_range *this_00;
  int *piVar3;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int bits;
  uint64_t data;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  SpanReader *in_stack_ffffffffffffffb8;
  uint64_t local_30;
  int local_c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI < 0) || (0x40 < in_ESI)) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"nbits must be between 0 and 64");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  else {
    local_30 = 0;
    for (local_c = in_ESI; 0 < local_c; local_c = local_c - iVar1) {
      if (*(int *)(in_RDI + 0xc) == 8) {
        SpanReader::operator>>(in_stack_ffffffffffffffb8,(uchar *)in_stack_ffffffffffffffb0);
        *(undefined4 *)(in_RDI + 0xc) = 0;
      }
      piVar3 = std::min<int>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      iVar1 = *piVar3;
      local_30 = (long)((int)((uint)*(byte *)(in_RDI + 8) <<
                              ((byte)*(undefined4 *)(in_RDI + 0xc) & 0x1f) & 0xff) >>
                       (8 - (byte)iVar1 & 0x1f)) | local_30 << ((byte)iVar1 & 0x3f);
      *(int *)(in_RDI + 0xc) = iVar1 + *(int *)(in_RDI + 0xc);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return local_30;
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t Read(int nbits) {
        if (nbits < 0 || nbits > 64) {
            throw std::out_of_range("nbits must be between 0 and 64");
        }

        uint64_t data = 0;
        while (nbits > 0) {
            if (m_offset == 8) {
                m_istream >> m_buffer;
                m_offset = 0;
            }

            int bits = std::min(8 - m_offset, nbits);
            data <<= bits;
            data |= static_cast<uint8_t>(m_buffer << m_offset) >> (8 - bits);
            m_offset += bits;
            nbits -= bits;
        }
        return data;
    }